

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O0

_Bool qp_resize(priority_queue *qp,size_t size,_func_void_void_ptr *payload_free)

{
  priority_queue_element *ppVar1;
  ulong local_30;
  size_t i;
  _func_void_void_ptr *payload_free_local;
  size_t size_local;
  priority_queue *qp_local;
  
  if ((qp != (priority_queue *)0x0) && (qp->count <= qp->size)) {
    if (size < 0x1000000000000000) {
      if ((size < qp->count) && (local_30 = size, payload_free != (_func_void_void_ptr *)0x0)) {
        for (; local_30 < qp->count; local_30 = local_30 + 1) {
          (*payload_free)(qp->data[local_30].payload.p);
        }
        qp->count = size;
      }
      ppVar1 = (priority_queue_element *)mem_realloc(qp->data,size << 4);
      qp->data = ppVar1;
      qp->size = size;
      qp_local._7_1_ = false;
    }
    else {
      qp_local._7_1_ = true;
    }
    return qp_local._7_1_;
  }
  __assert_fail("qp && qp->count <= qp->size",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-queue.c"
                ,0xe3,"_Bool qp_resize(struct priority_queue *, size_t, void (*)(void *))");
}

Assistant:

bool qp_resize(struct priority_queue *qp, size_t size,
		void (*payload_free)(void*))
{
	assert(qp && qp->count <= qp->size);
	if (size > SIZE_MAX / MAX(2, sizeof(struct priority_queue_element))) {
		return true;
	}
	if (size < qp->count && payload_free) {
		size_t i;

		for (i = size; i < qp->count; ++i) {
			(*payload_free)(qp->data[i].payload.p);
		}
		qp->count = size;
	}
	qp->data = mem_realloc(qp->data, size * sizeof(*qp->data));
	qp->size = size;
	return false;
}